

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLRootParser14.cpp
# Opt level: O2

LibraryCamerasLoader * __thiscall
COLLADASaxFWL::RootParser14::
beginCommonWithId<COLLADASaxFWL::LibraryCamerasLoader,COLLADASaxFWL::LibraryCamerasLoader14>
          (RootParser14 *this,char *id)

{
  FileLoader *pFVar1;
  LibraryCamerasLoader *this_00;
  LibraryCamerasLoader14 *this_01;
  
  IFilePartLoader::deleteFilePartLoader((IFilePartLoader *)this->mFileLoader);
  this_00 = (LibraryCamerasLoader *)operator_new(0x30);
  LibraryCamerasLoader::LibraryCamerasLoader(this_00,(IFilePartLoader *)this->mFileLoader);
  this_01 = (LibraryCamerasLoader14 *)operator_new(0x20);
  LibraryCamerasLoader14::LibraryCamerasLoader14(this_01,this_00);
  (this_00->super_FilePartLoader).super_IFilePartLoader.mParserImpl = (IParserImpl *)this_01;
  pFVar1 = this->mFileLoader;
  (pFVar1->super_DocumentProcessor).super_IFilePartLoader.mPartLoader = (IFilePartLoader *)this_00;
  (*(pFVar1->super_DocumentProcessor).super_IFilePartLoader.super_ExtraDataLoader.
    _vptr_ExtraDataLoader[9])(pFVar1,&(this_01->super_IParserImpl14).super_ColladaParserAutoGen14);
  DocumentProcessor::addToSidTree(&this->mFileLoader->super_DocumentProcessor,id,(char *)0x0);
  return this_00;
}

Assistant:

Loader* RootParser14::beginCommonWithId( const char * id)
	{
		mFileLoader->deleteFilePartLoader();
		Loader* loader = new Loader(mFileLoader);
		Loader14* loader14 = new Loader14(loader);
		loader->setParserImpl( loader14 );
		mFileLoader->setPartLoader(loader);
		mFileLoader->setParser(loader14);
		mFileLoader->addToSidTree( id, 0);
		return loader;
	}